

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstrum_postfilter.cc
# Opt level: O0

void __thiscall
sptk::MelCepstrumPostfilter::MelCepstrumPostfilter
          (MelCepstrumPostfilter *this,int num_order,int impulse_response_length,int onset_index,
          double alpha,double beta)

{
  bool bVar1;
  undefined4 in_ECX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  int num_order_00;
  FrequencyTransform *this_00;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  CepstrumToAutocorrelation *in_stack_ffffffffffffffd0;
  
  *in_RDI = &PTR__MelCepstrumPostfilter_0012aba8;
  *(undefined4 *)(in_RDI + 1) = in_ECX;
  in_RDI[2] = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  this_00 = (FrequencyTransform *)(in_RDI + 3);
  FrequencyTransform::FrequencyTransform
            (this_00,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  CepstrumToAutocorrelation::CepstrumToAutocorrelation
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             (int)((ulong)(in_RDI + 7) >> 0x20));
  num_order_00 = (int)((ulong)(in_RDI + 0x17) >> 0x20);
  MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
            ((MelCepstrumToMlsaDigitalFilterCoefficients *)this_00,num_order_00,
             in_stack_ffffffffffffffa0);
  MlsaDigitalFilterCoefficientsToMelCepstrum::MlsaDigitalFilterCoefficientsToMelCepstrum
            ((MlsaDigitalFilterCoefficientsToMelCepstrum *)this_00,num_order_00,
             (double)(in_RDI + 0x1b));
  *(undefined1 *)(in_RDI + 0x1f) = 1;
  bVar1 = IsInRange(*(int *)(in_RDI + 1),0,in_ESI);
  if ((((!bVar1) ||
       (bVar1 = FrequencyTransform::IsValid((FrequencyTransform *)(in_RDI + 3)), !bVar1)) ||
      (bVar1 = CepstrumToAutocorrelation::IsValid((CepstrumToAutocorrelation *)(in_RDI + 7)), !bVar1
      )) || ((bVar1 = MelCepstrumToMlsaDigitalFilterCoefficients::IsValid
                                ((MelCepstrumToMlsaDigitalFilterCoefficients *)(in_RDI + 0x17)),
             !bVar1 || (bVar1 = MlsaDigitalFilterCoefficientsToMelCepstrum::IsValid
                                          ((MlsaDigitalFilterCoefficientsToMelCepstrum *)
                                           (in_RDI + 0x1b)), !bVar1)))) {
    *(undefined1 *)(in_RDI + 0x1f) = 0;
  }
  return;
}

Assistant:

MelCepstrumPostfilter::MelCepstrumPostfilter(int num_order,
                                             int impulse_response_length,
                                             int onset_index, double alpha,
                                             double beta)
    : onset_index_(onset_index),
      beta_(beta),
      frequency_transform_(num_order, impulse_response_length - 1, -alpha),
      cepstrum_to_autocorrelation_(impulse_response_length - 1, 0,
                                   impulse_response_length),
      mel_cepstrum_to_mlsa_digital_filter_coefficients_(num_order, alpha),
      mlsa_digital_filter_coefficients_to_mel_cepstrum_(num_order, alpha),
      is_valid_(true) {
  if (!sptk::IsInRange(onset_index_, 0, num_order) ||
      !frequency_transform_.IsValid() ||
      !cepstrum_to_autocorrelation_.IsValid() ||
      !mel_cepstrum_to_mlsa_digital_filter_coefficients_.IsValid() ||
      !mlsa_digital_filter_coefficients_to_mel_cepstrum_.IsValid()) {
    is_valid_ = false;
    return;
  }
}